

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Uint32 anon_unknown.dwarf_14b954f::MachineRunner::sdl_callback(Uint32 param_1,void *param)

{
  char cVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  double dVar6;
  unique_lock<std::mutex> lock_guard;
  unique_lock<std::mutex> local_68;
  double local_58;
  double local_50;
  double local_48;
  float local_38;
  
  if (*(int *)((long)param + 0x2c) != 0) {
    LOCK();
    *(undefined4 *)((long)param + 0x2c) = 2;
    UNLOCK();
    return 4;
  }
  lVar2 = std::chrono::_V2::system_clock::now();
  if (500000000 < lVar2 - *(long *)((long)param + 0x18)) {
    *(long *)((long)param + 0x18) = lVar2 + -500000000;
  }
  lVar5 = *(long *)((long)param + 0x20);
  local_68._M_device = *param;
  local_68._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_68);
  local_68._M_owns = true;
  plVar3 = (long *)(**(code **)(**(long **)((long)param + 8) + 0x28))();
  plVar4 = (long *)(**(code **)(**(long **)((long)param + 8) + 0x20))();
  if ((lVar5 <= lVar2) && (*(long *)((long)param + 0x18) < lVar5)) {
    (**(code **)(*plVar3 + 8))(&local_50,plVar3);
    *(undefined8 *)((long)param + 0x40) = 0x3ff0000000000000;
    if (local_48 < 1e-05) {
      local_58 = (*(double *)((long)param + 0x158) * *(double *)((long)param + 0x38)) / local_50;
      *(double *)((long)param + 0x40) = local_58;
      dVar6 = round(local_58);
      if (0.0 < dVar6) {
        dVar6 = local_58 / dVar6;
        *(double *)((long)param + 0x40) = dVar6;
        if ((dVar6 <= 1.03) && (0.970873786407767 <= dVar6)) {
          (**(code **)*plVar4)
                    ((double)(lVar5 - *(long *)((long)param + 0x18)) / 1000000000.0,plVar4);
          (**(code **)(*plVar4 + 0x28))(plVar4,3);
          (**(code **)(*plVar3 + 8))(&local_50,plVar3);
          dVar6 = 1.0 / (*(double *)((long)param + 0x40) / *(double *)((long)param + 0x38));
          if (0.0 < local_38) {
            if (0.5 <= local_38) {
              dVar6 = dVar6 * 1.005;
            }
            else {
              dVar6 = dVar6 / 1.005;
            }
          }
          dVar6 = *(double *)((long)param + 0x30) * 0.95 + dVar6 * 0.05;
          *(double *)((long)param + 0x30) = dVar6;
          (**(code **)(*plVar4 + 8))(*(double *)((long)param + 0x38) * dVar6,plVar4);
          std::unique_lock<std::mutex>::unlock(&local_68);
          do {
            LOCK();
            cVar1 = *(char *)((long)param + 0x28);
            *(char *)((long)param + 0x28) = '\x01';
            UNLOCK();
          } while (cVar1 != '\0');
          std::unique_lock<std::mutex>::lock(&local_68);
          goto LAB_004581e5;
        }
      }
    }
  }
  (**(code **)(*plVar4 + 8))(*(undefined8 *)((long)param + 0x38),plVar4);
  lVar5 = *(long *)((long)param + 0x18);
LAB_004581e5:
  (**(code **)*plVar4)((double)(lVar2 - lVar5) / 1000000000.0,plVar4);
  (**(code **)(*plVar4 + 0x28))(plVar4,3);
  *(long *)((long)param + 0x18) = lVar2;
  std::unique_lock<std::mutex>::~unique_lock(&local_68);
  return 4;
}

Assistant:

static Uint32 sdl_callback(Uint32, void *param) {
			reinterpret_cast<MachineRunner *>(param)->update();
			return timer_period;
		}